

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int bPhraseToAnd,int iCol,char *zExpr,Fts5Expr **ppNew,
                      char **pzErr)

{
  Fts5Parse *pFVar1;
  undefined8 uVar2;
  int iVar3;
  fts5yyParser *fts5yypParser_00;
  ushort *puVar4;
  byte *pbVar5;
  Fts5ExprNode *pFVar6;
  Fts5ExprPhrase *pFVar7;
  ulong uVar8;
  Fts5ExprNode *p;
  long lVar9;
  Fts5Colset *pFVar10;
  Fts5Expr *pFVar11;
  byte bVar12;
  Fts5ExprNode *pFVar13;
  long lVar14;
  ushort uVar15;
  uint uVar16;
  fts5YYMINORTYPE *extraout_RDX;
  fts5YYMINORTYPE *extraout_RDX_00;
  uchar *fts5yypminor;
  fts5YYMINORTYPE *extraout_RDX_01;
  fts5YYMINORTYPE *extraout_RDX_02;
  fts5YYMINORTYPE *extraout_RDX_03;
  fts5YYMINORTYPE *fts5yypminor_00;
  fts5YYMINORTYPE *extraout_RDX_04;
  fts5YYMINORTYPE *extraout_RDX_05;
  fts5YYMINORTYPE *extraout_RDX_06;
  fts5yyStackEntry *pfVar17;
  Fts5ExprNode *pFVar18;
  Fts5ExprNearset *pNear;
  fts5yyParser *fts5yypParser;
  ulong uVar19;
  byte bVar20;
  ushort *puVar21;
  ushort *puVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  Fts5Parse sParse;
  ushort *local_a8;
  Fts5Parse local_78;
  ushort *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fts5yypParser_00 = (fts5yyParser *)0x0;
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_78.pExpr = (Fts5ExprNode *)0x0;
  local_78.rc = 0;
  local_78.nPhrase = 0;
  local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  local_78.pConfig = (Fts5Config *)0x0;
  local_78.zErr = (char *)0x0;
  local_78._44_4_ = 0;
  local_78.bPhraseToAnd = bPhraseToAnd;
  iVar3 = sqlite3_initialize();
  fts5yypminor = (uchar *)extraout_RDX;
  if (iVar3 == 0) {
    fts5yypParser_00 = (fts5yyParser *)sqlite3Malloc(0x980);
    fts5yypminor = (uchar *)extraout_RDX_00;
  }
  if (fts5yypParser_00 != (fts5yyParser *)0x0) {
    fts5yypParser_00->fts5yystack = fts5yypParser_00->fts5yystk0;
    fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystk0 + 99;
    fts5yypParser_00->fts5yytos = fts5yypParser_00->fts5yystk0;
    fts5yypParser_00->fts5yystk0[0].stateno = '\0';
    fts5yypParser_00->fts5yystk0[0].major = '\0';
    local_a8 = (ushort *)zExpr;
    local_78.pConfig = pConfig;
LAB_001dfe66:
    puVar4 = local_a8;
    puVar21 = local_a8;
    while( true ) {
      bVar20 = (byte)*puVar21;
      if (0x1f < bVar20) break;
      fts5yypminor = (uchar *)(ulong)(bVar20 - 9);
      if ((1 < bVar20 - 9) && (bVar20 != 0xd)) {
        if (bVar20 == 0) {
          uVar16 = 0;
          goto LAB_001dff6a;
        }
        goto switchD_001dfe8f_caseD_21;
      }
switchD_001dfe8f_caseD_20:
      puVar21 = (ushort *)((long)puVar21 + 1);
      puVar4 = (ushort *)((long)puVar4 + 1);
    }
    if (bVar20 < 0x3a) {
      uVar16 = bVar20 - 0x20;
      if (0xd < uVar16) goto switchD_001dfe8f_caseD_21;
      fts5yypminor = (uchar *)((long)&switchD_001dfe8f::switchdataD_002030f8 +
                              (long)(int)(&switchD_001dfe8f::switchdataD_002030f8)[uVar16]);
      switch((uint)bVar20) {
      case 0x20:
        goto switchD_001dfe8f_caseD_20;
      default:
        goto switchD_001dfe8f_caseD_21;
      case 0x22:
        puVar22 = puVar21;
        goto LAB_001dff00;
      case 0x28:
        uVar16 = 10;
        break;
      case 0x29:
        uVar16 = 0xb;
        break;
      case 0x2a:
        uVar16 = 0xf;
        break;
      case 0x2b:
        uVar16 = 0xe;
        break;
      case 0x2c:
        uVar16 = 0xd;
        break;
      case 0x2d:
        uVar16 = 6;
      }
      goto LAB_001dff6a;
    }
    if (bVar20 < 0x7b) {
      if (bVar20 == 0x3a) {
        uVar16 = 5;
LAB_001dff6a:
        uVar23 = 1;
        goto LAB_001dff70;
      }
      if (bVar20 == 0x5e) {
        uVar16 = 0xc;
        goto LAB_001dff6a;
      }
    }
    else {
      if (bVar20 == 0x7b) {
        uVar16 = 7;
        goto LAB_001dff6a;
      }
      if (bVar20 == 0x7d) {
        uVar16 = 8;
        goto LAB_001dff6a;
      }
    }
switchD_001dfe8f_caseD_21:
    if ((char)bVar20 < '\0') {
      bVar24 = false;
    }
    else {
      bVar24 = (&DAT_00208e80)[bVar20] == '\0';
    }
    if (bVar24) {
      sqlite3Fts5ParseError(&local_78,"fts5: syntax error near \"%.1s\"",puVar21);
      uVar16 = 0xaaaaaaaa;
      uVar23 = 1;
      fts5yypminor = (uchar *)extraout_RDX_05;
    }
    else {
      lVar14 = 0;
      while ((lVar9 = (long)(char)*(byte *)((long)puVar21 + lVar14 + 1), lVar9 < 0 ||
             (fts5yypminor = &DAT_00208e80, (&DAT_00208e80)[lVar9] != '\0'))) {
        lVar14 = lVar14 + 1;
      }
      uVar16 = 9;
      iVar3 = (int)lVar14;
      if (iVar3 == 1) {
        uVar16 = (uint)(*puVar21 != 0x524f) * 8 + 1;
      }
      if ((iVar3 == 2) &&
         (fts5yypminor = (uchar *)0x3, (byte)puVar21[1] == 0x54 && *puVar21 == 0x4f4e)) {
        uVar16 = 3;
      }
      uVar23 = lVar14 + 1;
      if ((iVar3 == 2) &&
         (uVar15 = (byte)puVar21[1] ^ 0x44 | *puVar21 ^ 0x4e41,
         fts5yypminor = (uchar *)(ulong)uVar15, uVar15 == 0)) {
        uVar16 = 2;
      }
    }
    uVar19 = 0;
    if (!bVar24) {
LAB_001dff70:
      local_a8 = (ushort *)((long)(int)uVar23 + (long)puVar21);
      uVar19 = (ulong)uVar16;
    }
    goto LAB_001dff7e;
  }
  iVar3 = 7;
  goto LAB_001e06e1;
LAB_001dff00:
  do {
    if (*(byte *)((long)puVar22 + 1) == 0x22) {
      if ((byte)puVar22[1] != 0x22) {
        uVar23 = (ulong)(((int)puVar22 - (int)puVar4) + 2);
        uVar16 = 9;
        goto LAB_001dff70;
      }
      puVar22 = puVar22 + 1;
    }
    else {
      puVar22 = (ushort *)((long)puVar22 + 1);
    }
  } while ((byte)*puVar22 != 0);
  uVar19 = 0;
  sqlite3Fts5ParseError(&local_78,"unterminated string");
  uVar23 = 1;
  fts5yypminor = (uchar *)extraout_RDX_01;
LAB_001dff7e:
  local_48 = (ushort *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  fts5yypParser_00->pParse = &local_78;
  bVar20 = fts5yypParser_00->fts5yytos->stateno;
  do {
    if (bVar20 < 0x23) {
      lVar14 = (long)((fts5yyParser *)(uVar19 & 0xff))->fts5yystk0 +
               ((ulong)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[bVar20] - 0x20);
      fts5yypminor = 
      "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
      ;
      pbVar5 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar20;
      if ("\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
          [lVar14] == (uchar)uVar19) {
        pbVar5 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                 + lVar14;
      }
      bVar20 = *pbVar5;
    }
    if (bVar20 < 0x53) {
      if (bVar20 < 0x50) {
        pfVar17 = fts5yypParser_00->fts5yytos;
        fts5yypParser_00->fts5yytos = pfVar17 + 1;
        if (fts5yypParser_00->fts5yystackEnd < pfVar17 + 1) {
          fts5yypParser_00->fts5yytos = pfVar17;
          fts5yyStackOverflow(fts5yypParser_00);
          fts5yypminor = (uchar *)extraout_RDX_03;
        }
        else {
          fts5yypminor = (uchar *)(ulong)bVar20;
          bVar12 = bVar20 + 0x1f;
          if (bVar20 < 0x23) {
            bVar12 = bVar20;
          }
          pfVar17[1].stateno = bVar12;
          pfVar17[1].major = (uchar)uVar19;
          pfVar17[1].minor.fts5yy0.p = (char *)puVar21;
          pfVar17[1].minor.fts5yy0.n = (int)uVar23;
        }
      }
      else if (bVar20 == 0x51) {
        fts5yypParser_00->fts5yytos = fts5yypParser_00->fts5yytos + -1;
      }
      else {
        puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,(int)uVar23);
        pFVar1 = fts5yypParser_00->pParse;
        local_48 = puVar21;
        sqlite3Fts5ParseError(pFVar1,"fts5: syntax error near \"%.*s\"",uVar23 & 0xffffffff);
        fts5yypParser_00->pParse = pFVar1;
        fts5yy_destructor((fts5yyParser *)(uVar19 & 0xff),(uchar)&local_48,fts5yypminor_00);
        fts5yypminor = (uchar *)extraout_RDX_04;
      }
      break;
    }
    if (((bVar20 == 0x6e) || (bVar20 == 0x69)) &&
       (fts5yypParser_00->fts5yystackEnd <= fts5yypParser_00->fts5yytos)) {
      fts5yyStackOverflow(fts5yypParser_00);
      bVar24 = false;
      fts5yypminor = (uchar *)extraout_RDX_02;
      goto LAB_001e033a;
    }
    pfVar17 = fts5yypParser_00->fts5yytos;
    if (0x1b < bVar20 - 0x53) goto switchD_001e0039_caseD_5f;
    pFVar1 = fts5yypParser_00->pParse;
    switch((uint)bVar20) {
    case 0x53:
      pFVar1->pExpr = (Fts5ExprNode *)(pfVar17->minor).fts5yy0.p;
      break;
    case 0x54:
      pFVar7 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar1,pfVar17[-1].minor.fts5yy11);
      goto LAB_001e0213;
    default:
      pFVar6 = (Fts5ExprNode *)pfVar17[-1].minor.fts5yy0.p;
      goto LAB_001e02d8;
    case 0x56:
    case 0x59:
      pFVar6 = (Fts5ExprNode *)
               sqlite3Fts5ParseColset(pFVar1,(Fts5Colset *)0x0,&(pfVar17->minor).fts5yy0);
      goto LAB_001e0150;
    case 0x57:
      pFVar10 = sqlite3Fts5ParseColset(pFVar1,(Fts5Colset *)0x0,&(pfVar17->minor).fts5yy0);
      pfVar17[-1].minor.fts5yy11 = pFVar10;
      pFVar7 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar1,pFVar10);
      goto LAB_001e02ba;
    case 0x58:
      pFVar7 = (Fts5ExprPhrase *)
               sqlite3Fts5ParseColset(pFVar1,pfVar17[-1].minor.fts5yy11,&(pfVar17->minor).fts5yy0);
      goto LAB_001e02ba;
    case 0x5a:
      pFVar6 = pfVar17[-2].minor.fts5yy24;
      pFVar13 = (pfVar17->minor).fts5yy24;
      iVar3 = 2;
      goto LAB_001e02d0;
    case 0x5b:
      pFVar6 = pfVar17[-2].minor.fts5yy24;
      pFVar13 = (pfVar17->minor).fts5yy24;
      iVar3 = 1;
      goto LAB_001e02d0;
    case 0x5c:
      pFVar6 = pfVar17[-2].minor.fts5yy24;
      pFVar13 = (pfVar17->minor).fts5yy24;
      iVar3 = 3;
LAB_001e02d0:
      pFVar6 = sqlite3Fts5ParseNode(pFVar1,iVar3,pFVar6,pFVar13,(Fts5ExprNearset *)0x0);
LAB_001e02d8:
      pfVar17[-2].minor.fts5yy0.p = (char *)pFVar6;
      break;
    case 0x5d:
      sqlite3Fts5ParseSetColset(pFVar1,pfVar17[-1].minor.fts5yy24,pfVar17[-4].minor.fts5yy11);
      pfVar17[-4].minor.fts5yy0.p = pfVar17[-1].minor.fts5yy0.p;
      break;
    case 0x5f:
    case 0x60:
      break;
    case 0x61:
      pFVar6 = pfVar17[-1].minor.fts5yy24;
      pFVar13 = (pfVar17->minor).fts5yy24;
      if (pFVar1->rc == 0) {
        p = pFVar6;
        if (pFVar6->eType == 2) {
          p = pFVar6->apChild[(long)pFVar6->nChild + -1];
        }
        if (pFVar13->eType == 0) {
          sqlite3Fts5ParseNodeFree(pFVar13);
          pFVar1->nPhrase = pFVar1->nPhrase + -1;
        }
        else if (p->eType == 0) {
          pFVar18 = pFVar13;
          if (p != pFVar6) {
            pFVar6->apChild[(long)pFVar6->nChild + -1] = pFVar13;
            pFVar18 = pFVar6;
          }
          uVar16 = pFVar13->pNear->nPhrase;
          lVar14 = (long)(int)(~uVar16 + pFVar1->nPhrase);
          memmove(pFVar1->apPhrase + lVar14,pFVar1->apPhrase + lVar14 + 1,(long)(int)uVar16 << 3);
          pFVar1->nPhrase = pFVar1->nPhrase + -1;
          sqlite3Fts5ParseNodeFree(p);
          pFVar6 = pFVar18;
        }
        else {
          pFVar6 = sqlite3Fts5ParseNode(pFVar1,2,pFVar6,pFVar13,(Fts5ExprNearset *)0x0);
        }
      }
      else {
        sqlite3Fts5ParseNodeFree(pFVar6);
        sqlite3Fts5ParseNodeFree(pFVar13);
        pFVar6 = (Fts5ExprNode *)0x0;
      }
      pfVar17[-1].minor.fts5yy0.p = (char *)pFVar6;
      break;
    case 0x62:
      pFVar6 = sqlite3Fts5ParseNode
                         (pFVar1,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,(pfVar17->minor).fts5yy46
                         );
      goto LAB_001e0150;
    case 99:
      pFVar6 = sqlite3Fts5ParseNode
                         (pFVar1,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,(pfVar17->minor).fts5yy46
                         );
      sqlite3Fts5ParseSetColset(pFVar1,pFVar6,pfVar17[-2].minor.fts5yy11);
      pfVar17[-2].minor.fts5yy24 = pFVar6;
      break;
    case 100:
    case 0x67:
      pFVar6 = (Fts5ExprNode *)
               sqlite3Fts5ParseNearset(pFVar1,(Fts5ExprNearset *)0x0,(pfVar17->minor).fts5yy53);
LAB_001e0150:
      (pfVar17->minor).fts5yy46 = (Fts5ExprNearset *)pFVar6;
      break;
    case 0x65:
      pFVar7 = (pfVar17->minor).fts5yy53;
      if ((pFVar7 != (Fts5ExprPhrase *)0x0) && (pFVar7->nTerm != 0)) {
        pFVar7->aTerm[0].bFirst = '\x01';
      }
      pFVar7 = (pfVar17->minor).fts5yy53;
      pNear = (Fts5ExprNearset *)0x0;
      goto LAB_001e02b5;
    case 0x66:
      uVar16 = pfVar17[-4].minor.fts5yy0.n;
      if ((uVar16 != 4) || ((pfVar17[-4].minor.fts5yy11)->nCol != 0x5241454e)) {
        sqlite3Fts5ParseError
                  (pFVar1,"fts5: syntax error near \"%.*s\"",(ulong)uVar16,
                   pfVar17[-4].minor.fts5yy0.p);
      }
      if (pfVar17[-2].minor.fts5yy11 != (Fts5Colset *)0x0) {
        iVar3 = pfVar17[-1].minor.fts5yy0.n;
        if (iVar3 == 0) {
          iVar3 = 10;
        }
        else if (iVar3 < 1) {
          iVar3 = 0;
        }
        else {
          lVar14 = 0;
          iVar3 = 0;
          do {
            bVar12 = pfVar17[-1].minor.fts5yy0.p[lVar14];
            if (9 < (byte)(bVar12 - 0x30)) {
              sqlite3Fts5ParseError(pFVar1,"expected integer, got \"%.*s\"");
              goto LAB_001e03a0;
            }
            iVar3 = (uint)bVar12 + iVar3 * 10 + -0x30;
            lVar14 = lVar14 + 1;
          } while (lVar14 < pfVar17[-1].minor.fts5yy0.n);
        }
        (pfVar17[-2].minor.fts5yy11)->nCol = iVar3;
      }
LAB_001e03a0:
      pfVar17[-4].minor.fts5yy0.p = pfVar17[-2].minor.fts5yy0.p;
      break;
    case 0x68:
      pNear = pfVar17[-1].minor.fts5yy46;
      pFVar7 = (pfVar17->minor).fts5yy53;
LAB_001e02b5:
      pFVar7 = (Fts5ExprPhrase *)sqlite3Fts5ParseNearset(pFVar1,pNear,pFVar7);
      goto LAB_001e02ba;
    case 0x69:
      pfVar17[1].minor.fts5yy0.p = (char *)0x0;
      pfVar17[1].minor.fts5yy0.n = 0;
      break;
    case 0x6a:
      uVar2 = *(undefined8 *)((long)&pfVar17->minor + 8);
      pfVar17[-1].minor.fts5yy0.p = (pfVar17->minor).fts5yy0.p;
      *(undefined8 *)((long)&pfVar17[-1].minor + 8) = uVar2;
      break;
    case 0x6b:
      pFVar7 = sqlite3Fts5ParseTerm
                         (pFVar1,pfVar17[-3].minor.fts5yy53,&pfVar17[-1].minor.fts5yy0,
                          (pfVar17->minor).fts5yyinit);
LAB_001e0213:
      pfVar17[-3].minor.fts5yy53 = pFVar7;
      break;
    case 0x6c:
      pFVar7 = sqlite3Fts5ParseTerm
                         (pFVar1,(Fts5ExprPhrase *)0x0,&pfVar17[-1].minor.fts5yy0,
                          (pfVar17->minor).fts5yyinit);
LAB_001e02ba:
      pfVar17[-1].minor.fts5yy53 = pFVar7;
      break;
    case 0x6d:
      (pfVar17->minor).fts5yyinit = 1;
      break;
    case 0x6e:
      pfVar17[1].minor.fts5yyinit = 0;
    }
switchD_001e0039_caseD_5f:
    uVar8 = (ulong)bVar20 + 0xffffffad & 0xffffffff;
    bVar12 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
             [uVar8];
    pfVar17 = pfVar17 + (long)fts5yyRuleInfoNRhs[uVar8] + 1;
    fts5yypminor = (uchar *)((long)fts5yy_reduce_ofst[pfVar17[-1].stateno] + (ulong)bVar12);
    bVar20 = *(byte *)((long)fts5yypminor + 0x209010);
    fts5yypParser_00->fts5yytos = pfVar17;
    pfVar17->stateno = bVar20;
    pfVar17->major = bVar12;
    bVar24 = true;
LAB_001e033a:
  } while (bVar24);
  if (((int)uVar19 == 0) || (local_78.rc != 0)) goto LAB_001e05c8;
  goto LAB_001dfe66;
LAB_001e05c8:
  for (pfVar17 = fts5yypParser_00->fts5yytos; fts5yypParser_00->fts5yystack < pfVar17;
      pfVar17 = pfVar17 + -1) {
    if (0xf < pfVar17->major) {
      fts5yy_destructor((fts5yyParser *)(ulong)pfVar17->major,(char)pfVar17 + '\b',
                        (fts5YYMINORTYPE *)fts5yypminor);
      fts5yypminor = (uchar *)extraout_RDX_06;
    }
  }
  sqlite3_free(fts5yypParser_00);
  if (((local_78.rc == 0) && (iCol < pConfig->nCol)) &&
     (pFVar10 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_78.rc,8), pFVar10 != (Fts5Colset *)0x0))
  {
    pFVar10->nCol = 1;
    pFVar10->aiCol[0] = iCol;
    sqlite3Fts5ParseSetColset(&local_78,local_78.pExpr,pFVar10);
  }
  if (local_78.rc == 0) {
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      pFVar11 = (Fts5Expr *)sqlite3Malloc(0x28);
    }
    else {
      pFVar11 = (Fts5Expr *)0x0;
    }
    *ppNew = pFVar11;
    if (pFVar11 == (Fts5Expr *)0x0) {
      local_78.rc = 7;
      goto LAB_001e0642;
    }
    pFVar11->pRoot = local_78.pExpr;
    pFVar11->pIndex = (Fts5Index *)0x0;
    pFVar11->pConfig = pConfig;
    pFVar11->apExprPhrase = local_78.apPhrase;
    pFVar11->nPhrase = local_78.nPhrase;
    pFVar11->bDesc = 0;
    local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  }
  else {
LAB_001e0642:
    sqlite3Fts5ParseNodeFree(local_78.pExpr);
  }
  sqlite3_free(local_78.apPhrase);
  if (*pzErr == (char *)0x0) {
    *pzErr = local_78.zErr;
  }
  else {
    sqlite3_free(local_78.zErr);
  }
  iVar3 = local_78.rc;
LAB_001e06e1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int bPhraseToAnd,
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew,
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  sParse.bPhraseToAnd = bPhraseToAnd;
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  assert( sParse.pExpr || sParse.rc!=SQLITE_OK );
  assert_expr_depth_ok(sParse.rc, sParse.pExpr);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( sParse.rc==SQLITE_OK && iCol<pConfig->nCol ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      pNew->pRoot = sParse.pExpr;
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      pNew->bDesc = 0;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  if( 0==*pzErr ){
    *pzErr = sParse.zErr;
  }else{
    sqlite3_free(sParse.zErr);
  }
  return sParse.rc;
}